

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

double fas197(double *b,int pq,void *params)

{
  int a;
  int MQ;
  int N_00;
  int MR_00;
  int MRP1_00;
  double *P;
  double *Q;
  double *VW_00;
  double *VL_00;
  double *VK_00;
  alik_object obj;
  int MRP1;
  int MR;
  double *VL;
  double *VK;
  double *VW;
  double *theta;
  double *phi;
  int N;
  int ifault;
  int i;
  int iq;
  int ip;
  double delta;
  double fact;
  double ssq;
  double value;
  void *params_local;
  double *pdStack_38;
  int pq_local;
  double *b_local;
  
  delta = 0.0;
  fact = 0.0;
  ssq = 0.0;
  a = *params;
  MQ = *(int *)((long)params + 8);
  N_00 = *(int *)((long)params + 0x18);
  value = (double)params;
  params_local._4_4_ = pq;
  pdStack_38 = b;
  MR_00 = imax(a,MQ + 1);
  MRP1_00 = MR_00 + 1;
  P = (double *)malloc((long)a << 3);
  Q = (double *)malloc((long)MQ << 3);
  VW_00 = (double *)malloc((long)MRP1_00 << 3);
  VL_00 = (double *)malloc((long)MRP1_00 << 3);
  VK_00 = (double *)malloc((long)MR_00 << 3);
  for (N = 0; N < a; N = N + 1) {
    P[N] = pdStack_38[N];
  }
  for (N = 0; N < MQ; N = N + 1) {
    Q[N] = pdStack_38[N + a];
  }
  if (*(int *)((long)params + 0x1c) == 1) {
    for (N = 0; N < N_00; N = N + 1) {
      *(double *)((long)params + (long)N * 8 + 0x680) =
           *(double *)((long)params + (long)(N_00 * 2 + N) * 8 + 0x680) - pdStack_38[a + MQ];
    }
  }
  *(double *)((long)params + 0x30) = fact;
  flikam(P,a,Q,MQ,(double *)((long)params + 0x680),(double *)((long)params + (long)N_00 * 8 + 0x680)
         ,N_00,&fact,&delta,VW_00,VL_00,MRP1_00,VK_00,MR_00,0.001);
  ssq = fact * delta;
  free(P);
  free(Q);
  free(VW_00);
  free(VL_00);
  free(VK_00);
  return ssq;
}

Assistant:

double fas197(double *b, int pq, void *params) {
	double value, ssq, fact, delta;
	int ip, iq, i, ifault, N;
	double *phi, *theta,*VW,*VK,*VL;
	int MR, MRP1;

	value = ssq = fact = 0.0;
	alik_object obj = (alik_object)params;

	ip = obj->p;
	iq = obj->q;
	N = obj->N;
	MR = imax(ip, iq + 1);
	MRP1 = MR + 1;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);
	VW = (double*)malloc(sizeof(double*)*MRP1);
	VL = (double*)malloc(sizeof(double*)*MRP1);
	VK = (double*)malloc(sizeof(double*)*MR);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip + iq];
		}
	}


	delta = 0.001;
	//mdisplay(P, 1, np);

	obj->ssq = ssq;
	//mdisplay(phi, 1, ip);
	ifault = flikam(phi, ip, theta, iq, obj->x, obj->x+N, N, &ssq, &fact, VW, VL, MRP1, VK, MR, delta);
	value = ssq*fact;

	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(VW);
	free(VL);
	free(VK);
	//free(bt);
	return value;
}